

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O3

LPCUTF8 __thiscall Js::Utf8SourceInfo::GetSource(Utf8SourceInfo *this,char16 *reason)

{
  LPCUTF8 puVar1;
  ISourceHolder *pIVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  char16_t *pcVar7;
  
  if ((this->sourceHolder).ptr == (ISourceHolder *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x3e,"(this->sourceHolder != nullptr)","We have no source mapper.")
    ;
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  puVar1 = (this->debugModeSource).ptr;
  if ((byte)(((byte)this->field_0xa8 >> 5 | puVar1 != (LPCUTF8)0x0) & (this->field_0xa8 & 0x40) >> 6
            ) != 0) {
    return puVar1;
  }
  pIVar2 = (this->sourceHolder).ptr;
  pcVar7 = L"Utf8SourceInfo::GetSource";
  if (reason != (char16 *)0x0) {
    pcVar7 = reason;
  }
  iVar5 = (*(pIVar2->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[6])(pIVar2,pcVar7);
  return (LPCUTF8)CONCAT44(extraout_var,iVar5);
}

Assistant:

LPCUTF8 Utf8SourceInfo::GetSource(const char16 * reason) const
    {
        AssertMsg(this->sourceHolder != nullptr, "We have no source mapper.");
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            AssertMsg(this->debugModeSource != nullptr || this->debugModeSourceIsEmpty, "Debug mode source should have been set by this point.");
            return debugModeSource;
        }
        else
#endif
        {
            return sourceHolder->GetSource(reason == nullptr ? _u("Utf8SourceInfo::GetSource") : reason);
        }
    }